

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pStateChangeTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Performance::anon_unknown_0::StateChangeCase::renderReference
          (StateChangeCase *this,Functions *gl)

{
  int callNdx;
  int iVar1;
  
  (*(this->super_StateChangePerformanceCase).super_TestCase.super_TestNode._vptr_TestNode[8])
            (this,gl,0);
  for (iVar1 = 0; iVar1 < (this->super_StateChangePerformanceCase).m_callCount; iVar1 = iVar1 + 1) {
    deqp::gls::StateChangePerformanceCase::callDraw(&this->super_StateChangePerformanceCase,gl);
  }
  (*(this->super_StateChangePerformanceCase).super_TestCase.super_TestNode._vptr_TestNode[8])
            (this,gl,1);
  for (iVar1 = 0; iVar1 < (this->super_StateChangePerformanceCase).m_callCount; iVar1 = iVar1 + 1) {
    deqp::gls::StateChangePerformanceCase::callDraw(&this->super_StateChangePerformanceCase,gl);
  }
  return;
}

Assistant:

void StateChangeCase::renderReference (const glw::Functions& gl)
{
	changeState(gl, 0);

	for (int callNdx = 0; callNdx < m_callCount; callNdx++)
		callDraw(gl);

	changeState(gl, 1);

	for (int callNdx = 0; callNdx < m_callCount; callNdx++)
		callDraw(gl);
}